

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanim.cpp
# Opt level: O2

void rw::hAnimFrameRead(Stream *stream,Animation *anim)

{
  void *pvVar1;
  int32 iVar2;
  long lVar3;
  void *data;
  float32 fVar4;
  
  pvVar1 = anim->keyframes;
  data = (void *)((long)pvVar1 + 0x1c);
  for (lVar3 = 0; lVar3 < anim->numFrames; lVar3 = lVar3 + 1) {
    fVar4 = Stream::readF32(stream);
    *(float32 *)((long)data + -0x14) = fVar4;
    Stream::read32(stream,(void *)((long)data + -0x10),0x10);
    Stream::read32(stream,data,0xc);
    iVar2 = Stream::readI32(stream);
    *(void **)((long)data + -0x1c) = (void *)((long)(iVar2 / 0x24) * 0x28 + (long)pvVar1);
    data = (void *)((long)data + 0x28);
  }
  return;
}

Assistant:

static void
hAnimFrameRead(Stream *stream, Animation *anim)
{
	HAnimKeyFrame *frames = (HAnimKeyFrame*)anim->keyframes;
	for(int32 i = 0; i < anim->numFrames; i++){
		frames[i].time = stream->readF32();
		stream->read32(&frames[i].q, 4*4);
		stream->read32(&frames[i].t, 3*4);
		int32 prev = stream->readI32()/0x24;
		frames[i].prev = &frames[prev];
	}
}